

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

bool __thiscall cmFileCopier::CheckKeyword(cmFileCopier *this,string *arg)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)arg);
  if (iVar1 == 0) {
    if (this->CurrentMatchRule == (MatchRule *)0x0) {
      this->Doing = 2;
      return true;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)arg);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)arg);
      if (iVar1 == 0) {
        this->Doing = 5;
        return true;
      }
      iVar1 = std::__cxx11::string::compare((char *)arg);
      if (iVar1 == 0) {
        this->Doing = 6;
        return true;
      }
      iVar1 = std::__cxx11::string::compare((char *)arg);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)arg);
        if (iVar1 == 0) {
          if (this->CurrentMatchRule != (MatchRule *)0x0) {
            (this->CurrentMatchRule->Properties).Exclude = true;
            goto LAB_0032d98b;
          }
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)arg);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)arg);
            if (iVar1 == 0) {
              if (this->CurrentMatchRule == (MatchRule *)0x0) {
                this->Doing = 7;
                this->UseGivenPermissionsFile = true;
                return true;
              }
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)arg);
              if (iVar1 == 0) {
                if (this->CurrentMatchRule == (MatchRule *)0x0) {
                  this->Doing = 8;
                  this->UseGivenPermissionsDir = true;
                  return true;
                }
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)arg);
                if (iVar1 == 0) {
                  if (this->CurrentMatchRule == (MatchRule *)0x0) {
                    this->Doing = 0;
                    this->UseSourcePermissions = true;
                    return true;
                  }
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)arg);
                  if (iVar1 == 0) {
                    if (this->CurrentMatchRule == (MatchRule *)0x0) {
                      this->Doing = 0;
                      this->UseSourcePermissions = false;
                      return true;
                    }
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)arg);
                    if (iVar1 != 0) {
                      return false;
                    }
                    if (this->CurrentMatchRule == (MatchRule *)0x0) {
                      this->Doing = 0;
                      this->MatchlessFiles = false;
                      return true;
                    }
                  }
                }
              }
            }
            goto LAB_0032d93e;
          }
          if (this->CurrentMatchRule != (MatchRule *)0x0) {
            this->Doing = 9;
            return true;
          }
        }
        NotBeforeMatch(this,arg);
        return true;
      }
      this->FollowSymlinkChain = true;
LAB_0032d98b:
      this->Doing = 0;
      return true;
    }
    if (this->CurrentMatchRule == (MatchRule *)0x0) {
      this->Doing = 3;
      return true;
    }
  }
LAB_0032d93e:
  NotAfterMatch(this,arg);
  return true;
}

Assistant:

bool cmFileCopier::CheckKeyword(std::string const& arg)
{
  if (arg == "DESTINATION") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingDestination;
    }
  } else if (arg == "FILES_FROM_DIR") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingFilesFromDir;
    }
  } else if (arg == "PATTERN") {
    this->Doing = DoingPattern;
  } else if (arg == "REGEX") {
    this->Doing = DoingRegex;
  } else if (arg == "FOLLOW_SYMLINK_CHAIN") {
    this->FollowSymlinkChain = true;
    this->Doing = DoingNone;
  } else if (arg == "EXCLUDE") {
    // Add this property to the current match rule.
    if (this->CurrentMatchRule) {
      this->CurrentMatchRule->Properties.Exclude = true;
      this->Doing = DoingNone;
    } else {
      this->NotBeforeMatch(arg);
    }
  } else if (arg == "PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->Doing = DoingPermissionsMatch;
    } else {
      this->NotBeforeMatch(arg);
    }
  } else if (arg == "FILE_PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingPermissionsFile;
      this->UseGivenPermissionsFile = true;
    }
  } else if (arg == "DIRECTORY_PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingPermissionsDir;
      this->UseGivenPermissionsDir = true;
    }
  } else if (arg == "USE_SOURCE_PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->UseSourcePermissions = true;
    }
  } else if (arg == "NO_SOURCE_PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->UseSourcePermissions = false;
    }
  } else if (arg == "FILES_MATCHING") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MatchlessFiles = false;
    }
  } else {
    return false;
  }
  return true;
}